

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O0

Encoding * __thiscall cmsys::Encoding::ToWide_abi_cxx11_(Encoding *this,char *cstr)

{
  size_t sVar1;
  size_type __n;
  wchar_t *pwVar2;
  allocator_type local_51;
  undefined1 local_50 [8];
  vector<wchar_t,_std::allocator<wchar_t>_> wchars;
  size_t length;
  char *cstr_local;
  wstring *wstr;
  
  std::__cxx11::wstring::wstring((wstring *)this);
  sVar1 = cmsysEncoding_mbstowcs((wchar_t *)0x0,cstr,0);
  __n = sVar1 + 1;
  if (__n != 0) {
    std::allocator<wchar_t>::allocator();
    std::vector<wchar_t,_std::allocator<wchar_t>_>::vector
              ((vector<wchar_t,_std::allocator<wchar_t>_> *)local_50,__n,&local_51);
    std::allocator<wchar_t>::~allocator(&local_51);
    pwVar2 = std::vector<wchar_t,_std::allocator<wchar_t>_>::operator[]
                       ((vector<wchar_t,_std::allocator<wchar_t>_> *)local_50,0);
    sVar1 = cmsysEncoding_mbstowcs(pwVar2,cstr,__n);
    if (sVar1 != 0) {
      pwVar2 = std::vector<wchar_t,_std::allocator<wchar_t>_>::operator[]
                         ((vector<wchar_t,_std::allocator<wchar_t>_> *)local_50,0);
      std::__cxx11::wstring::operator=((wstring *)this,pwVar2);
    }
    std::vector<wchar_t,_std::allocator<wchar_t>_>::~vector
              ((vector<wchar_t,_std::allocator<wchar_t>_> *)local_50);
  }
  return this;
}

Assistant:

std::wstring Encoding::ToWide(const char* cstr)
{
  std::wstring wstr;
  size_t length = kwsysEncoding_mbstowcs(0, cstr, 0) + 1;
  if (length > 0) {
    std::vector<wchar_t> wchars(length);
    if (kwsysEncoding_mbstowcs(&wchars[0], cstr, length) > 0) {
      wstr = &wchars[0];
    }
  }
  return wstr;
}